

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

void __thiscall
TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test::
~TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test
          (TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalMemoryAccountant_00389eb8;
  ExecFunctionWithoutParameters::~ExecFunctionWithoutParameters
            ((ExecFunctionWithoutParameters *)
             &(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).testFunction);
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).fixture);
  GlobalMemoryAccountant::~GlobalMemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).accountant);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST(GlobalMemoryAccountant, reportWithCacheSizes)
{
    size_t cacheSizes[] = {512};
    accountant.useCacheSizes(cacheSizes, 1);
    accountant.start();
    char* memory = new char[185];
    delete [] memory;
    accountant.stop();

    /* Allocation includes memory leak info */
    STRCMP_CONTAINS("512                   1                1                 1", accountant.report().asCharString());
}